

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

void __thiscall duckdb_snappy::SnappyIOVecReader::Skip(SnappyIOVecReader *this,size_t n)

{
  ulong uVar1;
  iovec *piVar2;
  size_t sVar3;
  
  uVar1 = this->curr_size_remaining_;
  if (n != 0 && uVar1 <= n) {
    piVar2 = this->curr_iov_;
    sVar3 = this->total_size_remaining_;
    do {
      n = n - uVar1;
      piVar2 = piVar2 + 1;
      do {
        sVar3 = sVar3 - uVar1;
        if (sVar3 == 0) {
          this->total_size_remaining_ = 0;
          this->curr_pos_ = (char *)0x0;
          this->curr_size_remaining_ = 0;
          goto LAB_01d3237a;
        }
        this->curr_iov_ = piVar2;
        this->curr_pos_ = (char *)piVar2->iov_base;
        uVar1 = piVar2->iov_len;
        this->curr_size_remaining_ = uVar1;
        piVar2 = piVar2 + 1;
      } while (uVar1 == 0);
      this->total_size_remaining_ = sVar3;
LAB_01d3237a:
      piVar2 = piVar2 + -1;
      uVar1 = this->curr_size_remaining_;
    } while ((n != 0) && (uVar1 <= n));
  }
  this->curr_size_remaining_ = uVar1 - n;
  this->total_size_remaining_ = this->total_size_remaining_ - n;
  this->curr_pos_ = this->curr_pos_ + n;
  return;
}

Assistant:

void Skip(size_t n) override {
    while (n >= curr_size_remaining_ && n > 0) {
      n -= curr_size_remaining_;
      Advance();
    }
    curr_size_remaining_ -= n;
    total_size_remaining_ -= n;
    curr_pos_ += n;
  }